

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

double units::generateLeadingNumber(string *ustring,size_t *index)

{
  byte bVar1;
  pointer pcVar2;
  double dVar3;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  ulong __pos;
  size_t sVar7;
  double dVar8;
  double dVar9;
  size_t oindex;
  size_t local_68;
  double local_60;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *index = 0;
  dVar8 = getNumberBlock(ustring,index);
  if (NAN(dVar8)) {
LAB_003ad1a9:
    *index = 0;
  }
  else {
    __pos = *index;
    if (__pos < ustring->_M_string_length) {
      do {
        pcVar2 = (ustring->_M_dataplus)._M_p;
        bVar1 = pcVar2[__pos];
        uVar5 = (ulong)bVar1;
        dVar3 = dVar8;
        if (uVar5 < 0x30) {
          if ((0x840000000000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_003ad0d5;
          if (uVar5 != 0x28) {
            if ((0x680000000000U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_003ad0cc;
            dVar8 = NAN;
            goto LAB_003ad1a9;
          }
          local_68 = 0;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ustring,__pos,
                 0xffffffffffffffff);
          dVar9 = getNumberBlock((string *)&local_50,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            local_60 = dVar9;
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            dVar9 = local_60;
          }
          if (!NAN(dVar9)) {
            dVar8 = dVar8 * dVar9;
            sVar7 = local_68;
            sVar6 = *index;
            goto LAB_003ad16b;
          }
        }
        else {
LAB_003ad0cc:
          if (bVar1 != 0x78) {
            return dVar8;
          }
LAB_003ad0d5:
          sVar7 = __pos + 1;
          bVar4 = looksLikeNumber(ustring,sVar7);
          if ((!bVar4) && (pcVar2[sVar7] != '(')) {
            return dVar8;
          }
          local_68 = 0;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ustring,sVar7,
                 0xffffffffffffffff);
          dVar9 = getNumberBlock((string *)&local_50,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            local_60 = dVar9;
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            dVar9 = local_60;
          }
          if (!NAN(dVar9)) {
            sVar7 = *index;
            sVar6 = local_68;
            if ((ustring->_M_dataplus)._M_p[sVar7] == '/') {
              dVar8 = dVar8 / dVar9;
            }
            else {
              dVar8 = dVar8 * dVar9;
            }
LAB_003ad16b:
            *index = sVar7 + sVar6 + 1;
            dVar3 = local_58;
          }
        }
        local_58 = dVar3;
        if (NAN(dVar9)) {
          return local_58;
        }
        __pos = *index;
        if (ustring->_M_string_length <= __pos) {
          return dVar8;
        }
      } while( true );
    }
  }
  return dVar8;
}

Assistant:

double generateLeadingNumber(const std::string& ustring, size_t& index) noexcept
{
    index = 0;
    double val = getNumberBlock(ustring, index);
    if (std::isnan(val)) {
        index = 0;
        return val;
    }
    while (true) {
        if (index >= ustring.size()) {
            return val;
        }
        switch (ustring[index]) {
            case '.':
            case '-':
            case '+':
                index = 0;
                return constants::invalid_conversion;
            case '/':
            case '*':
            case 'x':
                if (looksLikeNumber(ustring, index + 1) ||
                    ustring[index + 1] == '(') {
                    size_t oindex{0};
                    double res =
                        getNumberBlock(ustring.substr(index + 1), oindex);
                    if (!std::isnan(res)) {
                        if (ustring[index] == '/') {
                            val /= res;
                        } else {
                            val *= res;
                        }

                        index = oindex + index + 1;
                    } else {
                        return val;
                    }
                } else {
                    return val;
                }
                break;
            case '(': {
                size_t oindex{0};
                double res = getNumberBlock(ustring.substr(index), oindex);
                if (!std::isnan(res)) {
                    val *= res;
                    index = oindex + index + 1;
                } else {
                    return val;
                }
                break;
            }
            default:
                return val;
        }
    }
}